

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

bool __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::operator==
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this,
          Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *o)

{
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  lVar5 = (long)this->_cursor - (long)this->_stack;
  if (lVar5 == (long)o->_cursor - (long)o->_stack) {
    if (this->_cursor == this->_stack) {
      bVar4 = true;
    }
    else {
      lVar6 = (lVar5 >> 2) * 0x6db6db6db6db6db7;
      lVar5 = 0;
      do {
        lVar6 = lVar6 + -1;
        pMVar1 = this->_stack;
        pMVar2 = o->_stack;
        bVar3 = Kernel::operator==((PolyNf *)
                                   ((pMVar1->term).super_PolyNfSuper._inner.
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    .
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                    ._content + lVar5 + -1),
                                   (PolyNf *)
                                   ((pMVar2->term).super_PolyNfSuper._inner.
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    .
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                    ._content + lVar5 + -1));
        bVar7 = *(int *)((long)(&pMVar1->term + 1) + lVar5) ==
                *(int *)((long)(&pMVar2->term + 1) + lVar5);
        bVar4 = bVar7 && bVar3;
        if (!bVar7 || !bVar3) {
          return bVar4;
        }
        lVar5 = lVar5 + 0x1c;
      } while (lVar6 != 0);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }